

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O3

int __thiscall ncnn::Reshape::load_param(Reshape *this,ParamDict *pd)

{
  string *expr;
  int iVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> outshape;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> blobs;
  string local_78;
  string local_50;
  
  iVar1 = ParamDict::get(pd,0,-0xe9);
  this->w = iVar1;
  iVar1 = ParamDict::get(pd,1,-0xe9);
  this->h = iVar1;
  iVar1 = ParamDict::get(pd,0xb,-0xe9);
  this->d = iVar1;
  iVar1 = ParamDict::get(pd,2,-0xe9);
  this->c = iVar1;
  iVar2 = (this->d != -0xe9) + 3;
  if (iVar1 == -0xe9) {
    iVar2 = 2;
  }
  if (this->h == -0xe9) {
    iVar2 = 1;
  }
  if (this->w == -0xe9) {
    iVar2 = 0;
  }
  this->ndim = iVar2;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  ParamDict::get(&local_50,pd,6,&local_78);
  expr = &this->shape_expr;
  std::__cxx11::string::operator=((string *)expr,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((this->shape_expr)._M_string_length != 0) {
    iVar1 = count_expression_blobs(expr);
    if (1 < iVar1) {
      (this->super_Layer).one_blob_only = false;
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_50,(long)iVar1,
               (allocator_type *)&local_78);
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity = 0;
    iVar1 = eval_list_expression
                      (expr,(vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_50,
                       (vector<int,_std::allocator<int>_> *)&local_78);
    if (iVar1 == 0) {
      this->ndim = (int)(local_78._M_string_length - (long)local_78._M_dataplus._M_p >> 2);
    }
    if (local_78._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_78._M_dataplus._M_p,
                      local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p);
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_50);
    if (iVar1 != 0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

int Reshape::load_param(const ParamDict& pd)
{
    w = pd.get(0, -233);
    h = pd.get(1, -233);
    d = pd.get(11, -233);
    c = pd.get(2, -233);

    ndim = 4;
    if (d == -233)
        ndim = 3;
    if (c == -233)
        ndim = 2;
    if (h == -233)
        ndim = 1;
    if (w == -233)
        ndim = 0;

    shape_expr = pd.get(6, "");

    // count reference blobs
    if (!shape_expr.empty())
    {
        const int blob_count = count_expression_blobs(shape_expr);
        if (blob_count > 1)
            one_blob_only = false;

        // resolve ndim from expression
        std::vector<Mat> blobs(blob_count);
        std::vector<int> outshape;
        int er = eval_list_expression(shape_expr, blobs, outshape);
        if (er != 0)
            return -1;

        ndim = (int)outshape.size();
    }

    return 0;
}